

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_pcm.cpp
# Opt level: O0

void __thiscall
ymfm::pcm_registers::cache_channel_data(pcm_registers *this,uint32_t choffs,pcm_cache *cache)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t local_40;
  uint32_t local_3c;
  uint32_t local_30;
  int32_t correction;
  int32_t panpot;
  uint32_t fnum;
  int32_t octave;
  pcm_cache *cache_local;
  uint32_t choffs_local;
  pcm_registers *this_local;
  
  uVar1 = ch_octave(this,choffs);
  iVar2 = (int)(char)(uVar1 << 4) >> 4;
  uVar1 = ch_fnumber(this,choffs);
  cache->step = ((uVar1 | 0x400) << ((char)iVar2 + 7U & 0x1f)) >> 2;
  uVar3 = ch_total_level(this,choffs);
  cache->total_level = uVar3 << 10;
  uVar3 = ch_panpot(this,choffs);
  iVar4 = (int)(char)(uVar3 << 4) >> 4;
  if (iVar4 < 0) {
    if (iVar4 < -7) {
      cache->pan_right = 0x3ff;
      cache->pan_left = 0x3ff;
    }
    else {
      cache->pan_left = 0;
      if (iVar4 == -7) {
        local_40 = 0x3ff;
      }
      else {
        local_40 = iVar4 * -0x20;
      }
      cache->pan_right = local_40;
    }
  }
  else {
    if (iVar4 == 7) {
      local_3c = 0x3ff;
    }
    else {
      local_3c = iVar4 << 5;
    }
    cache->pan_left = local_3c;
    cache->pan_right = 0;
  }
  uVar3 = ch_lfo_speed(this,choffs);
  cache->lfo_step = "\x01\f\x13\x19\x1f#%*"[uVar3];
  uVar3 = ch_am_depth(this,choffs);
  cache->am_depth = ""[uVar3];
  uVar3 = ch_vibrato(this,choffs);
  cache->pm_depth = ""[uVar3];
  uVar3 = ch_sustain_level(this,choffs);
  cache->eg_sustain = uVar3;
  cache->eg_sustain = cache->eg_sustain + 1 & 0x10 | cache->eg_sustain;
  cache->eg_sustain = cache->eg_sustain << 5;
  uVar3 = ch_rate_correction(this,choffs);
  if (uVar3 == 0xf) {
    local_30 = 0;
  }
  else {
    local_30 = bitfield(uVar1,9,1);
    local_30 = (iVar2 + uVar3) * 2 + local_30;
  }
  uVar1 = ch_attack_rate(this,choffs);
  uVar1 = effective_rate(this,uVar1,local_30);
  cache->eg_rate[1] = (uint8_t)uVar1;
  uVar1 = ch_decay_rate(this,choffs);
  uVar1 = effective_rate(this,uVar1,local_30);
  cache->eg_rate[2] = (uint8_t)uVar1;
  uVar1 = ch_sustain_rate(this,choffs);
  uVar1 = effective_rate(this,uVar1,local_30);
  cache->eg_rate[3] = (uint8_t)uVar1;
  uVar1 = ch_release_rate(this,choffs);
  uVar1 = effective_rate(this,uVar1,local_30);
  cache->eg_rate[4] = (uint8_t)uVar1;
  cache->eg_rate[5] = '\x05';
  uVar1 = ch_damp(this,choffs);
  if (uVar1 != 0) {
    cache->eg_rate[2] = '0';
    cache->eg_rate[3] = '?';
    cache->eg_rate[4] = '?';
    cache->eg_sustain = 0x80;
  }
  return;
}

Assistant:

void pcm_registers::cache_channel_data(uint32_t choffs, pcm_cache &cache)
{
	// compute step from octave and fnumber; the math here implies
	// a .18 fraction but .16 should be perfectly fine
	int32_t octave = int8_t(ch_octave(choffs) << 4) >> 4;
	uint32_t fnum = ch_fnumber(choffs);
	cache.step = ((0x400 | fnum) << (octave + 7)) >> 2;

	// total level is computed as a .10 value for interpolation
	cache.total_level = ch_total_level(choffs) << 10;

	// compute panning values in terms of envelope attenuation
	int32_t panpot = int8_t(ch_panpot(choffs) << 4) >> 4;
	if (panpot >= 0)
	{
		cache.pan_left = (panpot == 7) ? 0x3ff : 0x20 * panpot;
		cache.pan_right = 0;
	}
	else if (panpot >= -7)
	{
		cache.pan_left = 0;
		cache.pan_right = (panpot == -7) ? 0x3ff : -0x20 * panpot;
	}
	else
		cache.pan_left = cache.pan_right = 0x3ff;

	// determine the LFO stepping value; this how much to add to a running
	// x.18 value for the LFO; steps were derived from frequencies in the
	// manual and come out very close with these values
	static const uint8_t s_lfo_steps[8] = { 1, 12, 19, 25, 31, 35, 37, 42 };
	cache.lfo_step = s_lfo_steps[ch_lfo_speed(choffs)];

	// AM LFO depth values, derived from the manual; note each has at most
	// 2 bits to make the "multiply" easy in hardware
	static const uint8_t s_am_depth[8] = { 0, 0x14, 0x20, 0x28, 0x30, 0x40, 0x50, 0x80 };
	cache.am_depth = s_am_depth[ch_am_depth(choffs)];

	// PM LFO depth values; these are converted from the manual's cents values
	// into f-numbers; the computations come out quite cleanly so pretty sure
	// these are correct
	static const uint8_t s_pm_depth[8] = { 0, 2, 3, 4, 6, 12, 24, 48 };
	cache.pm_depth = s_pm_depth[ch_vibrato(choffs)];

	// 4-bit sustain level, but 15 means 31 so effectively 5 bits
	cache.eg_sustain = ch_sustain_level(choffs);
	cache.eg_sustain |= (cache.eg_sustain + 1) & 0x10;
	cache.eg_sustain <<= 5;

	// compute the key scaling correction factor; 15 means don't do any correction
	int32_t correction = ch_rate_correction(choffs);
	if (correction == 15)
		correction = 0;
	else
		correction = (octave + correction) * 2 + bitfield(fnum, 9);

	// compute the envelope generator rates
	cache.eg_rate[EG_ATTACK] = effective_rate(ch_attack_rate(choffs), correction);
	cache.eg_rate[EG_DECAY] = effective_rate(ch_decay_rate(choffs), correction);
	cache.eg_rate[EG_SUSTAIN] = effective_rate(ch_sustain_rate(choffs), correction);
	cache.eg_rate[EG_RELEASE] = effective_rate(ch_release_rate(choffs), correction);
	cache.eg_rate[EG_REVERB] = 5;

	// if damping is on, override some things; essentially decay at a hardcoded
	// rate of 48 until -12db (0x80), then at maximum rate for the rest
	if (ch_damp(choffs) != 0)
	{
		cache.eg_rate[EG_DECAY] = 48;
		cache.eg_rate[EG_SUSTAIN] = 63;
		cache.eg_rate[EG_RELEASE] = 63;
		cache.eg_sustain = 0x80;
	}
}